

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mongoose.c
# Opt level: O3

int ns_vprintf(ns_connection *nc,char *fmt,__va_list_tag *ap)

{
  char *__ptr;
  uint uVar1;
  char *buf;
  char mem [500];
  char *local_220;
  char local_218 [504];
  
  local_220 = local_218;
  uVar1 = ns_avprintf(&local_220,500,fmt,ap);
  __ptr = local_220;
  if (0 < (int)uVar1) {
    ns_out(nc,local_220,(ulong)uVar1);
  }
  if (__ptr != (char *)0x0 && __ptr != local_218) {
    free(__ptr);
  }
  return uVar1;
}

Assistant:

int ns_vprintf(struct ns_connection *nc, const char *fmt, va_list ap) {
  char mem[NS_VPRINTF_BUFFER_SIZE], *buf = mem;
  int len;

  if ((len = ns_avprintf(&buf, sizeof(mem), fmt, ap)) > 0) {
    ns_out(nc, buf, len);
  }
  if (buf != mem && buf != NULL) {
    free(buf);
  }

  return len;
}